

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O1

void __thiscall tst_InsertProxyModel::testNullModel(tst_InsertProxyModel *this)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  QAbstractItemModelTester *this_00;
  int iVar4;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  anon_union_24_3_e3d07ef4_for_data local_c8;
  ulong local_b0;
  undefined1 local_a8 [24];
  InsertProxyModel proxyModel;
  QString local_78;
  QString local_60;
  QStringListModel validModel;
  undefined4 uStack_44;
  QArrayDataPointer<QString> local_38;
  
  InsertProxyModel::InsertProxyModel(&proxyModel,(QObject *)0x0);
  this_00 = (QAbstractItemModelTester *)operator_new(0x10);
  QAbstractItemModelTester::QAbstractItemModelTester
            (this_00,(QAbstractItemModel *)&proxyModel,QtTest,&this->super_QObject);
  *(undefined ***)this_00 = &PTR_metaObject_0012c978;
  _validModel = (code *)CONCAT44(uStack_44,1);
  InsertProxyModel::setInsertDirection(&proxyModel);
  InsertProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
  local_a8._0_8_ = (QArrayData *)0xffffffffffffffff;
  local_a8._8_8_ = (storage_type_conflict *)0x0;
  local_a8._16_8_ = (long *)0x0;
  iVar4 = (int)&local_c8;
  InsertProxyModel::index(iVar4,(int)&proxyModel,(QModelIndex *)0x0);
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = L"1";
  local_78.d.size = 1;
  QVariant::QVariant((QVariant *)&validModel,&local_78);
  bVar1 = InsertProxyModel::setData
                    ((QModelIndex *)&proxyModel,(QVariant *)&local_c8,(int)&validModel);
  cVar2 = QTest::qVerify((bool)(bVar1 ^ 1),
                         "!proxyModel.setData(proxyModel.index(0, 0), QStringLiteral(\"1\"))","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,0x1df);
  QVariant::~QVariant((QVariant *)&validModel);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
    }
  }
  if (cVar2 != '\0') {
    local_a8._0_8_ = (QArrayData *)0xffffffffffffffff;
    local_a8._8_8_ = (storage_type_conflict *)0x0;
    local_a8._16_8_ = (long *)0x0;
    InsertProxyModel::index(iVar4,(int)&proxyModel,(QModelIndex *)0x0);
    if ((long *)local_c8._16_8_ == (long *)0x0) {
      _validModel = (code *)0x0;
      local_38.d = (Data *)0x0;
      local_38.ptr = (QString *)0x2;
    }
    else {
      (**(code **)(*(long *)local_c8._16_8_ + 0x90))(&validModel,local_c8._16_8_,&local_c8,0);
    }
    local_78.d.d = (Data *)((ulong)local_38.ptr & 0xfffffffffffffffc);
    bVar1 = QMetaType::isValid();
    cVar2 = QTest::qVerify((bool)(bVar1 ^ 1),"!proxyModel.index(0, 0).data().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                           ,0x1e0);
    QVariant::~QVariant((QVariant *)&validModel);
    if (cVar2 != '\0') {
      bVar1 = InsertProxyModel::commitRow();
      cVar2 = QTest::qVerify((bool)(bVar1 ^ 1),"!proxyModel.commitRow()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                             ,0x1e1);
      if (cVar2 != '\0') {
        local_c8._16_8_ = (long *)0x0;
        local_c8.shared = (PrivateShared *)0x0;
        local_c8._8_8_ = 0;
        local_a8._0_8_ = (QArrayData *)0x0;
        local_a8._8_8_ = L"1";
        local_a8._16_8_ = (long *)0x1;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_c8,0,(QString *)local_a8);
        QStringListModel::QStringListModel(&validModel,(QList *)local_c8.data,(QObject *)0x0);
        if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_a8._0_8_ = *(int *)local_a8._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_a8._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,8);
          }
        }
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_c8);
        InsertProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
        local_78.d.d = (Data *)0xffffffffffffffff;
        local_78.d.ptr = (char16_t *)0x0;
        local_78.d.size = 0;
        InsertProxyModel::index((int)local_a8,(int)&proxyModel,(QModelIndex *)0x1);
        local_60.d.d = (Data *)0x0;
        local_60.d.ptr = L"2";
        local_60.d.size = 1;
        QVariant::QVariant((QVariant *)&local_c8,&local_60);
        bVar3 = (bool)InsertProxyModel::setData
                                ((QModelIndex *)&proxyModel,(QVariant *)local_a8,iVar4);
        cVar2 = QTest::qVerify(bVar3,
                               "proxyModel.setData(proxyModel.index(1, 0), QStringLiteral(\"2\"))",
                               "",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                               ,0x1e4);
        QVariant::~QVariant((QVariant *)&local_c8);
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
          }
        }
        if (cVar2 != '\0') {
          local_60.d.d = (Data *)0xffffffffffffffff;
          local_60.d.ptr = (char16_t *)0x0;
          local_60.d.size = 0;
          InsertProxyModel::index((int)&local_78,(int)&proxyModel,(QModelIndex *)0x1);
          if ((long *)local_78.d.size == (long *)0x0) {
            local_c8.shared = (PrivateShared *)0x0;
            local_c8._8_8_ = 0;
            local_c8._16_8_ = (long *)0x0;
            local_b0 = 2;
          }
          else {
            (**(code **)(*(long *)local_78.d.size + 0x90))(&local_c8,local_78.d.size,&local_78,0);
          }
          QVariant::toString();
          QVar5.m_data = (storage_type_conflict *)local_a8._8_8_;
          QVar5.m_size = local_a8._16_8_;
          QVar7.m_data = L"2";
          QVar7.m_size = 1;
          cVar2 = QTest::qCompare(QVar5,QVar7,"proxyModel.index(1, 0).data().toString()",
                                  "QStringLiteral(\"2\")",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                  ,0x1e5);
          if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_a8._0_8_ = *(int *)local_a8._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_a8._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,8);
            }
          }
          QVariant::~QVariant((QVariant *)&local_c8);
          if (cVar2 != '\0') {
            bVar3 = (bool)InsertProxyModel::commitRow();
            cVar2 = QTest::qVerify(bVar3,"proxyModel.commitRow()","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                   ,0x1e6);
            if (cVar2 != '\0') {
              local_60.d.d = (Data *)0xffffffffffffffff;
              local_60.d.ptr = (char16_t *)0x0;
              local_60.d.size = 0;
              QAbstractListModel::index((int)&local_78,(int)&validModel,(QModelIndex *)0x1);
              if ((long *)local_78.d.size == (long *)0x0) {
                local_c8.shared = (PrivateShared *)0x0;
                local_c8._8_8_ = 0;
                local_c8._16_8_ = (long *)0x0;
                local_b0 = 2;
              }
              else {
                (**(code **)(*(long *)local_78.d.size + 0x90))
                          (&local_c8,local_78.d.size,&local_78,0);
              }
              QVariant::toString();
              QVar6.m_data = (storage_type_conflict *)local_a8._8_8_;
              QVar6.m_size = local_a8._16_8_;
              QVar8.m_data = L"2";
              QVar8.m_size = 1;
              cVar2 = QTest::qCompare(QVar6,QVar8,"validModel.index(1, 0).data().toString()",
                                      "QStringLiteral(\"2\")",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                      ,0x1e7);
              if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
                LOCK();
                *(int *)local_a8._0_8_ = *(int *)local_a8._0_8_ + -1;
                UNLOCK();
                if (*(int *)local_a8._0_8_ == 0) {
                  QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,8);
                }
              }
              QVariant::~QVariant((QVariant *)&local_c8);
              if (cVar2 != '\0') {
                InsertProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
                local_78.d.d = (Data *)0xffffffffffffffff;
                local_78.d.ptr = (char16_t *)0x0;
                local_78.d.size = 0;
                InsertProxyModel::index((int)local_a8,(int)&proxyModel,(QModelIndex *)0x0);
                if ((long *)local_a8._16_8_ == (long *)0x0) {
                  local_c8.shared = (PrivateShared *)0x0;
                  local_c8._8_8_ = 0;
                  local_c8._16_8_ = (long *)0x0;
                  local_b0 = 2;
                }
                else {
                  (**(code **)(*(long *)local_a8._16_8_ + 0x90))
                            (&local_c8,local_a8._16_8_,local_a8,0);
                }
                local_60.d.d = (Data *)(local_b0 & 0xfffffffffffffffc);
                bVar1 = QMetaType::isValid();
                cVar2 = QTest::qVerify((bool)(bVar1 ^ 1),"!proxyModel.index(0, 0).data().isValid()",
                                       "",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                       ,0x1e9);
                QVariant::~QVariant((QVariant *)&local_c8);
                if (cVar2 != '\0') {
                  local_78.d.d = (Data *)0xffffffffffffffff;
                  local_78.d.ptr = (char16_t *)0x0;
                  local_78.d.size = 0;
                  InsertProxyModel::index((int)local_a8,(int)&proxyModel,(QModelIndex *)0x0);
                  local_60.d.d = (Data *)0x0;
                  local_60.d.ptr = L"3";
                  local_60.d.size = 1;
                  QVariant::QVariant((QVariant *)&local_c8,&local_60);
                  bVar1 = InsertProxyModel::setData
                                    ((QModelIndex *)&proxyModel,(QVariant *)local_a8,iVar4);
                  cVar2 = QTest::qVerify((bool)(bVar1 ^ 1),
                                         "!proxyModel.setData(proxyModel.index(0, 0), QStringLiteral(\"3\"))"
                                         ,"",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                         ,0x1ea);
                  QVariant::~QVariant((QVariant *)&local_c8);
                  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
                    }
                  }
                  if (cVar2 != '\0') {
                    local_78.d.d = (Data *)0xffffffffffffffff;
                    local_78.d.ptr = (char16_t *)0x0;
                    local_78.d.size = 0;
                    InsertProxyModel::index((int)local_a8,(int)&proxyModel,(QModelIndex *)0x0);
                    if ((long *)local_a8._16_8_ == (long *)0x0) {
                      local_c8.shared = (PrivateShared *)0x0;
                      local_c8._8_8_ = 0;
                      local_c8._16_8_ = (long *)0x0;
                      local_b0 = 2;
                    }
                    else {
                      (**(code **)(*(long *)local_a8._16_8_ + 0x90))
                                (&local_c8,local_a8._16_8_,local_a8,0);
                    }
                    local_60.d.d = (Data *)(local_b0 & 0xfffffffffffffffc);
                    bVar1 = QMetaType::isValid();
                    cVar2 = QTest::qVerify((bool)(bVar1 ^ 1),
                                           "!proxyModel.index(0, 0).data().isValid()","",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                           ,0x1eb);
                    QVariant::~QVariant((QVariant *)&local_c8);
                    if (cVar2 != '\0') {
                      bVar1 = InsertProxyModel::commitRow();
                      QTest::qVerify((bool)(bVar1 ^ 1),"!proxyModel.commitRow()","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                     ,0x1ec);
                    }
                  }
                }
              }
            }
          }
        }
        _validModel = QByteArray::reallocData;
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
        QAbstractListModel::~QAbstractListModel((QAbstractListModel *)&validModel);
      }
    }
  }
  InsertProxyModel::~InsertProxyModel(&proxyModel);
  return;
}

Assistant:

void tst_InsertProxyModel::testNullModel()
{
    InsertProxyModel proxyModel;
    new ModelTest(&proxyModel, this);
    proxyModel.setInsertDirection(InsertProxyModel::InsertRow);
    proxyModel.setSourceModel(nullptr);
    QVERIFY(!proxyModel.setData(proxyModel.index(0, 0), QStringLiteral("1")));
    QVERIFY(!proxyModel.index(0, 0).data().isValid());
    QVERIFY(!proxyModel.commitRow());
    QStringListModel validModel(QStringList() << QStringLiteral("1"));
    proxyModel.setSourceModel(&validModel);
    QVERIFY(proxyModel.setData(proxyModel.index(1, 0), QStringLiteral("2")));
    QCOMPARE(proxyModel.index(1, 0).data().toString(), QStringLiteral("2"));
    QVERIFY(proxyModel.commitRow());
    QCOMPARE(validModel.index(1, 0).data().toString(), QStringLiteral("2"));
    proxyModel.setSourceModel(nullptr);
    QVERIFY(!proxyModel.index(0, 0).data().isValid());
    QVERIFY(!proxyModel.setData(proxyModel.index(0, 0), QStringLiteral("3")));
    QVERIFY(!proxyModel.index(0, 0).data().isValid());
    QVERIFY(!proxyModel.commitRow());
}